

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O1

void cfd::api::CollectUtxoDataByFundRawTransaction
               (ConfidentialTransactionContext *ctx,
               vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
               *selected_txin_utxos,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               *txin_amount_map,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               *tx_amount_map,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *asset_list,int32_t *fee_index)

{
  Txid *pTVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  pointer pEVar5;
  _Base_ptr p_Var6;
  char cVar7;
  byte bVar8;
  _Base_ptr p_Var9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  iterator iVar11;
  mapped_type *pmVar12;
  iterator iVar13;
  mapped_type *pmVar14;
  __normal_iterator<cfd::core::OutPoint_*,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>
  _Var15;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  long lVar16;
  _func_int **pp_Var17;
  long lVar18;
  ulong uVar19;
  pointer *__x;
  initializer_list<cfd::core::OutPoint> __l;
  string asset;
  string asset_1;
  vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> outpoint_list;
  string asset_2;
  string token;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
  asset_utxo_map;
  BlindFactor asset_entropy;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  txin_list;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txout_list;
  pointer local_1e0;
  undefined **local_1c0;
  OutPoint local_1b0;
  _Base_ptr local_188;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
  *local_180;
  ConfidentialValue local_178;
  ConfidentialValue local_150;
  ConfidentialTransactionContext *local_128;
  long local_120;
  undefined1 local_118;
  key_type local_110;
  key_type local_f0;
  undefined1 local_d0 [16];
  _Base_ptr local_c0;
  _Base_ptr local_b8;
  _Base_ptr local_b0;
  pointer local_a8;
  BlindFactor local_98;
  long local_78;
  long local_70;
  long local_60;
  long local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_188 = (_Base_ptr)asset_list;
  local_180 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
               *)tx_amount_map;
  local_128 = ctx;
  cfd::core::ConfidentialTransaction::GetTxOutList();
  if (local_58 != local_60) {
    p_Var9 = (_Base_ptr)(local_180 + 8);
    lVar18 = 0x78;
    uVar19 = 0;
    do {
      lVar16 = local_60;
      cfd::core::Script::Script((Script *)local_d0,(Script *)(local_60 + lVar18 + -0x60));
      cVar7 = cfd::core::Script::IsEmpty();
      core::Script::~Script((Script *)local_d0);
      if (cVar7 == '\0') {
        cfd::core::ConfidentialAssetId::ConfidentialAssetId
                  ((ConfidentialAssetId *)local_d0,(ConfidentialAssetId *)(lVar16 + lVar18 + -0x28))
        ;
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
        local_d0._0_8_ = &PTR__ConfidentialAssetId_002b2ea0;
        if ((void *)CONCAT44(local_d0._12_4_,local_d0._8_4_) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_d0._12_4_,local_d0._8_4_));
        }
        p_Var6 = local_188;
        _Var10 = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                           (*(undefined8 *)local_188,local_188->_M_parent,&local_1b0);
        if ((_Base_ptr)_Var10._M_current == p_Var6->_M_parent) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_188,(value_type *)&local_1b0);
        }
        iVar13 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                         *)local_180,(key_type *)&local_1b0);
        if (iVar13._M_node == p_Var9) {
          local_d0._0_8_ = (_func_int **)0x0;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
          ::_M_emplace_unique<std::__cxx11::string&,long&>
                    (local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0
                     ,(long *)local_d0);
        }
        cfd::core::ConfidentialValue::ConfidentialValue
                  ((ConfidentialValue *)local_d0,(ConfidentialValue *)(lVar16 + lVar18));
        local_178._vptr_ConfidentialValue = (_func_int **)cfd::core::ConfidentialValue::GetAmount();
        local_178.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start._0_1_ = extraout_DL;
        lVar16 = cfd::core::Amount::GetSatoshiValue();
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                *)local_180,(key_type *)&local_1b0);
        *pmVar14 = *pmVar14 + lVar16;
        local_d0._0_8_ = &PTR__ConfidentialValue_002b2e40;
        if ((void *)CONCAT44(local_d0._12_4_,local_d0._8_4_) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_d0._12_4_,local_d0._8_4_));
        }
        if (local_1b0.txid_._vptr_Txid !=
            (_func_int **)
            ((long)&local_1b0.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8U))
        {
          operator_delete(local_1b0.txid_._vptr_Txid);
        }
      }
      else {
        *fee_index = (int32_t)uVar19;
      }
      uVar19 = uVar19 + 1;
      lVar18 = lVar18 + 0xf8;
    } while (uVar19 < (ulong)((local_58 - local_60 >> 3) * -0x1084210842108421));
  }
  local_b8 = (_Base_ptr)(local_d0 + 8);
  local_d0._8_4_ = _S_red;
  local_c0 = (_Base_ptr)0x0;
  local_a8 = (pointer)0x0;
  local_b0 = local_b8;
  cfd::core::ConfidentialTransaction::GetTxInList();
  local_1e0 = (selected_txin_utxos->
              super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
              )._M_impl.super__Vector_impl_data._M_start;
  pEVar5 = (selected_txin_utxos->
           super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (local_1e0 != pEVar5) {
    do {
      lVar18 = local_70;
      if (local_78 != local_70) {
        pTVar1 = &(local_1e0->utxo).txid;
        lVar16 = local_78;
        do {
          cfd::core::Txid::Txid(&local_1b0.txid_,(Txid *)(lVar16 + 8));
          cVar7 = cfd::core::Txid::Equals(&local_1b0.txid_);
          if (cVar7 == '\0') {
            local_1b0.txid_._vptr_Txid = (_func_int **)&PTR__Txid_002b2f00;
            if ((_func_int **)
                local_1b0.txid_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (_func_int **)0x0) {
              operator_delete(local_1b0.txid_.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
          }
          else {
            uVar2 = (local_1e0->utxo).vout;
            uVar3 = *(uint32_t *)(lVar16 + 0x28);
            local_1b0.txid_._vptr_Txid = (_func_int **)&PTR__Txid_002b2f00;
            if ((_func_int **)
                local_1b0.txid_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (_func_int **)0x0) {
              operator_delete(local_1b0.txid_.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (uVar2 == uVar3) {
              cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
              p_Var9 = local_188;
              _Var10 = std::
                       __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                 (*(undefined8 *)local_188,local_188->_M_parent,&local_178);
              if ((_Base_ptr)_Var10._M_current == p_Var9->_M_parent) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)p_Var9,(value_type *)&local_178);
              }
              iVar11 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                               *)local_d0,(key_type *)&local_178);
              if (iVar11._M_node == (_Base_ptr)(local_d0 + 8)) {
                cfd::core::OutPoint::OutPoint(&local_1b0,pTVar1,(local_1e0->utxo).vout);
                __l._M_len = 1;
                __l._M_array = &local_1b0;
                std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::vector
                          ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)
                           &local_150,__l,(allocator_type *)&local_98);
                local_1b0.txid_._vptr_Txid = (_func_int **)&PTR__Txid_002b2f00;
                if ((_func_int **)
                    local_1b0.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (_func_int **)0x0) {
                  operator_delete(local_1b0.txid_.data_.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                pmVar12 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                                        *)local_d0,(key_type *)&local_178);
                std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::operator=
                          (pmVar12,(vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>
                                    *)&local_150);
                std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::~vector
                          ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)
                           &local_150);
              }
              else {
                cfd::core::OutPoint::OutPoint(&local_1b0,pTVar1,(local_1e0->utxo).vout);
                pmVar12 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                                        *)local_d0,(key_type *)&local_178);
                std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::push_back
                          (pmVar12,&local_1b0);
                local_1b0.txid_._vptr_Txid = (_func_int **)&PTR__Txid_002b2f00;
                if ((_func_int **)
                    local_1b0.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (_func_int **)0x0) {
                  operator_delete(local_1b0.txid_.data_.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
              }
              iVar13 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                       ::find(&txin_amount_map->_M_t,(key_type *)&local_178);
              if ((_Rb_tree_header *)iVar13._M_node ==
                  &(txin_amount_map->_M_t)._M_impl.super__Rb_tree_header) {
                local_1b0.txid_._vptr_Txid = (_func_int **)0x0;
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                ::_M_emplace_unique<std::__cxx11::string&,long&>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                            *)txin_amount_map,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_178,(long *)&local_1b0);
              }
              lVar18 = cfd::core::Amount::GetSatoshiValue();
              pmVar14 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                        ::operator[](txin_amount_map,(key_type *)&local_178);
              *pmVar14 = *pmVar14 + lVar18;
              if (local_178._vptr_ConfidentialValue !=
                  (_func_int **)
                  ((long)&local_178.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data + 8U)) {
                operator_delete(local_178._vptr_ConfidentialValue);
              }
              break;
            }
          }
          lVar16 = lVar16 + 0x160;
        } while (lVar16 != lVar18);
      }
      local_1e0 = local_1e0 + 1;
    } while (local_1e0 != pEVar5);
  }
  if (local_78 != local_70) {
    local_128 = (ConfidentialTransactionContext *)(local_180 + 8);
    local_188 = &(txin_amount_map->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_1c0 = &PTR__ConfidentialValue_002b2e40;
    __x = (pointer *)(local_78 + 0x90);
    do {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1b0,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__x);
      cVar7 = cfd::core::ByteData256::IsEmpty();
      bVar8 = 1;
      if (cVar7 != '\0') {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_48,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(__x + 3));
        bVar8 = cfd::core::ByteData256::IsEmpty();
        bVar8 = bVar8 ^ 1;
        if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      if (local_1b0.txid_._vptr_Txid != (_func_int **)0x0) {
        operator_delete(local_1b0.txid_._vptr_Txid);
      }
      if (bVar8 != 0) {
        cfd::core::BlindFactor::BlindFactor(&local_98);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        local_f0._M_string_length = 0;
        local_f0.field_2._M_local_buf[0] = '\0';
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1b0,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__x);
        cVar7 = cfd::core::ByteData256::IsEmpty();
        if (local_1b0.txid_._vptr_Txid != (_func_int **)0x0) {
          operator_delete(local_1b0.txid_._vptr_Txid);
        }
        if (cVar7 == '\0') {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_178,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(__x + 3));
          cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_1b0,(ByteData256 *)&local_178);
          cfd::core::BlindFactor::operator=(&local_98,(BlindFactor *)&local_1b0);
          local_1b0.txid_._vptr_Txid = (_func_int **)&PTR__BlindFactor_002b2e70;
          pp_Var17 = local_178._vptr_ConfidentialValue;
          if ((_func_int **)
              local_1b0.txid_.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (_func_int **)0x0) {
            operator_delete(local_1b0.txid_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
            pp_Var17 = local_178._vptr_ConfidentialValue;
          }
        }
        else {
          cfd::core::Txid::Txid((Txid *)&local_178,(Txid *)(__x + -0x11));
          uVar4 = *(uint *)(__x + -0xd);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_150,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(__x + 3));
          cfd::core::ConfidentialTransaction::CalculateAssetEntropy
                    (&local_1b0.txid_,(uint)&local_178,(ByteData256 *)(ulong)uVar4);
          cfd::core::BlindFactor::operator=(&local_98,(BlindFactor *)&local_1b0);
          local_1b0.txid_._vptr_Txid = (_func_int **)&PTR__BlindFactor_002b2e70;
          if ((_func_int **)
              local_1b0.txid_.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (_func_int **)0x0) {
            operator_delete(local_1b0.txid_.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_150._vptr_ConfidentialValue != (_func_int **)0x0) {
            operator_delete(local_150._vptr_ConfidentialValue);
          }
          local_178._vptr_ConfidentialValue = (_func_int **)&PTR__Txid_002b2f00;
          if ((void *)CONCAT71(local_178.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               local_178.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
            operator_delete((void *)CONCAT71(local_178.data_.data_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                             local_178.data_.data_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_1_));
          }
          cfd::core::ConfidentialTransaction::CalculateReissuanceToken
                    ((BlindFactor *)&local_1b0,SUB81(&local_98,0));
          cfd::core::ConfidentialTransaction::CalculateReissuanceToken
                    ((BlindFactor *)&local_178,SUB81(&local_98,0));
          cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
          cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
          iVar13 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                           *)local_180,(key_type *)&local_150);
          if (((ConfidentialTransactionContext *)iVar13._M_node != local_128) ||
             (iVar13 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                               *)local_180,&local_110),
             (ConfidentialTransactionContext *)iVar13._M_node != local_128)) {
            std::__cxx11::string::_M_assign((string *)&local_f0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p);
          }
          if (local_150._vptr_ConfidentialValue !=
              (_func_int **)
              ((long)&local_150.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data + 8U)) {
            operator_delete(local_150._vptr_ConfidentialValue);
          }
          local_178._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialAssetId_002b2ea0;
          if ((void *)CONCAT71(local_178.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               local_178.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
            operator_delete((void *)CONCAT71(local_178.data_.data_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                             local_178.data_.data_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_1_));
          }
          local_1b0.txid_._vptr_Txid = (_func_int **)&PTR__ConfidentialAssetId_002b2ea0;
          pp_Var17 = (_func_int **)
                     local_1b0.txid_.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
        }
        if (pp_Var17 != (_func_int **)0x0) {
          operator_delete(pp_Var17);
        }
        cfd::core::ConfidentialTransaction::CalculateAsset((BlindFactor *)&local_1b0);
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_178,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__x);
        cVar7 = cfd::core::ByteData256::IsEmpty();
        if (local_178._vptr_ConfidentialValue != (_func_int **)0x0) {
          operator_delete(local_178._vptr_ConfidentialValue);
        }
        if (cVar7 == '\0') {
          iVar13 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                   ::find(&txin_amount_map->_M_t,&local_110);
          if (iVar13._M_node == local_188) {
            cfd::core::ConfidentialValue::ConfidentialValue
                      (&local_178,(ConfidentialValue *)(__x + 6));
            local_150._vptr_ConfidentialValue =
                 (_func_int **)cfd::core::ConfidentialValue::GetAmount();
            local_150.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start._0_1_ = extraout_DL_03;
            local_120 = cfd::core::Amount::GetSatoshiValue();
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
            ::_M_emplace_unique<std::__cxx11::string&,long>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                        *)txin_amount_map,&local_110,&local_120);
            local_178._vptr_ConfidentialValue = (_func_int **)local_1c0;
          }
          else {
            cfd::core::Txid::Txid((Txid *)&local_150,(Txid *)(__x + -0x11));
            cfd::core::OutPoint::OutPoint
                      ((OutPoint *)&local_178,(Txid *)&local_150,*(uint *)(__x + -0xd));
            local_150._vptr_ConfidentialValue = (_func_int **)&PTR__Txid_002b2f00;
            if ((void *)CONCAT71(local_150.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                                 local_150.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
              operator_delete((void *)CONCAT71(local_150.data_.data_.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                               local_150.data_.data_.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_1_));
            }
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                                    *)local_d0,&local_110);
            _Var15 = std::
                     __find_if<__gnu_cxx::__normal_iterator<cfd::core::OutPoint*,std::vector<cfd::core::OutPoint,std::allocator<cfd::core::OutPoint>>>,__gnu_cxx::__ops::_Iter_equals_val<cfd::core::OutPoint_const>>
                               ((pmVar12->
                                super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>
                                )._M_impl.super__Vector_impl_data._M_start,
                                (pmVar12->
                                super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>
                                )._M_impl.super__Vector_impl_data._M_finish,&local_178);
            if (_Var15._M_current ==
                (pmVar12->
                super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>).
                _M_impl.super__Vector_impl_data._M_finish) {
              cfd::core::ConfidentialValue::ConfidentialValue
                        (&local_150,(ConfidentialValue *)(__x + 6));
              local_120 = cfd::core::ConfidentialValue::GetAmount();
              local_118 = extraout_DL_02;
              lVar18 = cfd::core::Amount::GetSatoshiValue();
              pmVar14 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                        ::operator[](txin_amount_map,&local_110);
              *pmVar14 = *pmVar14 + lVar18;
              local_150._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_002b2e40;
              if ((void *)CONCAT71(local_150.data_.data_.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                   local_150.data_.data_.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0)
              {
                operator_delete((void *)CONCAT71(local_150.data_.data_.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                 local_150.data_.data_.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_1_));
              }
            }
            local_178._vptr_ConfidentialValue = (_func_int **)&PTR__Txid_002b2f00;
          }
LAB_00207662:
          if ((void *)CONCAT71(local_178.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               local_178.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
            operator_delete((void *)CONCAT71(local_178.data_.data_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                             local_178.data_.data_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_1_));
          }
        }
        else {
          iVar13 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                   ::find(&txin_amount_map->_M_t,&local_110);
          if (iVar13._M_node == local_188) {
            cfd::core::ConfidentialValue::ConfidentialValue
                      (&local_178,(ConfidentialValue *)(__x + 6));
            local_150._vptr_ConfidentialValue =
                 (_func_int **)cfd::core::ConfidentialValue::GetAmount();
            local_150.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start._0_1_ = extraout_DL_00;
            local_120 = cfd::core::Amount::GetSatoshiValue();
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
            ::_M_emplace_unique<std::__cxx11::string&,long>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                        *)txin_amount_map,&local_110,&local_120);
            local_178._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_002b2e40;
            if ((void *)CONCAT71(local_178.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                                 local_178.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
              operator_delete((void *)CONCAT71(local_178.data_.data_.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                               local_178.data_.data_.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_1_));
            }
          }
          if ((local_f0._M_string_length != 0) &&
             (iVar13 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                       ::find(&txin_amount_map->_M_t,&local_f0), iVar13._M_node == local_188)) {
            cfd::core::ConfidentialValue::ConfidentialValue
                      (&local_178,(ConfidentialValue *)(__x + 0xb));
            local_150._vptr_ConfidentialValue =
                 (_func_int **)cfd::core::ConfidentialValue::GetAmount();
            local_150.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start._0_1_ = extraout_DL_01;
            local_120 = cfd::core::Amount::GetSatoshiValue();
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
            ::_M_emplace_unique<std::__cxx11::string&,long>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                        *)txin_amount_map,&local_f0,&local_120);
            local_178._vptr_ConfidentialValue = (_func_int **)local_1c0;
            goto LAB_00207662;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        local_1b0.txid_._vptr_Txid = (_func_int **)&PTR__ConfidentialAssetId_002b2ea0;
        if ((_func_int **)
            local_1b0.txid_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (_func_int **)0x0) {
          operator_delete(local_1b0.txid_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        local_98._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_002b2e70;
        if (local_98.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      lVar18 = (long)(__x + 0x1a);
      __x = __x + 0x2c;
    } while (lVar18 != local_70);
  }
  std::
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ::~vector((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
             *)&local_78);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
               *)local_d0);
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
             *)&local_60);
  return;
}

Assistant:

void CollectUtxoDataByFundRawTransaction(
    const ConfidentialTransactionContext& ctx,
    const std::vector<ElementsUtxoAndOption>& selected_txin_utxos,
    std::map<std::string, int64_t>* txin_amount_map,
    std::map<std::string, int64_t>* tx_amount_map,
    std::vector<std::string>* asset_list, int32_t* fee_index) {
  const auto txout_list = ctx.GetTxOutList();
  for (size_t index = 0; index < txout_list.size(); ++index) {
    auto& txout = txout_list[index];
    if (txout.GetLockingScript().IsEmpty()) {
      // Excludes fees from collection
      *fee_index = static_cast<int32_t>(index);
    } else {
      std::string asset = txout.GetAsset().GetHex();
      if (std::find(asset_list->begin(), asset_list->end(), asset) ==
          asset_list->end()) {
        asset_list->push_back(asset);
      }

      if (tx_amount_map->find(asset) == tx_amount_map->end()) {
        int64_t amount = 0;
        tx_amount_map->emplace(asset, amount);
      }
      (*tx_amount_map)[asset] +=
          txout.GetConfidentialValue().GetAmount().GetSatoshiValue();
    }
  }
  std::map<std::string, std::vector<OutPoint>> asset_utxo_map;
  const auto txin_list = ctx.GetTxInList();  // txin_utxo_list
  for (const auto& elements_utxo : selected_txin_utxos) {
    for (const auto& txin : txin_list) {
      if ((txin.GetTxid().Equals(elements_utxo.utxo.txid)) &&
          (elements_utxo.utxo.vout == txin.GetVout())) {
        std::string asset = elements_utxo.utxo.asset.GetHex();
        if (std::find(asset_list->begin(), asset_list->end(), asset) ==
            asset_list->end()) {
          asset_list->push_back(asset);
        }
        if (asset_utxo_map.find(asset) == asset_utxo_map.end()) {
          std::vector<OutPoint> outpoint_list = {
              OutPoint(elements_utxo.utxo.txid, elements_utxo.utxo.vout)};
          asset_utxo_map[asset] = outpoint_list;
        } else {
          OutPoint outpoint(elements_utxo.utxo.txid, elements_utxo.utxo.vout);
          asset_utxo_map[asset].push_back(outpoint);
        }

        if (txin_amount_map->find(asset) == txin_amount_map->end()) {
          int64_t amount = 0;
          txin_amount_map->emplace(asset, amount);
        }
        (*txin_amount_map)[asset] +=
            elements_utxo.utxo.amount.GetSatoshiValue();
        break;
      }
    }
  }

  // append issuance txin data.
  for (const auto& txin : txin_list) {
    if (!txin.GetBlindingNonce().IsEmpty() ||
        !txin.GetAssetEntropy().IsEmpty()) {
      BlindFactor asset_entropy;
      std::string token;
      if (txin.GetBlindingNonce().IsEmpty()) {
        asset_entropy = ConfidentialTransaction::CalculateAssetEntropy(
            txin.GetTxid(), txin.GetVout(), txin.GetAssetEntropy());
        ConfidentialAssetId token1 =
            ConfidentialTransaction::CalculateReissuanceToken(
                asset_entropy, true);
        ConfidentialAssetId token2 =
            ConfidentialTransaction::CalculateReissuanceToken(
                asset_entropy, false);
        std::string token_blind = token1.GetHex();
        std::string token_unblind = token2.GetHex();
        if (tx_amount_map->find(token_blind) != tx_amount_map->end()) {
          token = token_blind;
        } else if (
            tx_amount_map->find(token_unblind) != tx_amount_map->end()) {
          token = token_unblind;
        }
      } else {
        asset_entropy = BlindFactor(txin.GetAssetEntropy());
      }
      ConfidentialAssetId asset_id =
          ConfidentialTransaction::CalculateAsset(asset_entropy);
      std::string asset = asset_id.GetHex();

      if (txin.GetBlindingNonce().IsEmpty()) {
        // At the time of issuance, add to map if it is not registered.
        if (txin_amount_map->find(asset) == txin_amount_map->end()) {
          txin_amount_map->emplace(
              asset, txin.GetIssuanceAmount().GetAmount().GetSatoshiValue());
        }
        if ((!token.empty()) &&
            (txin_amount_map->find(token) == txin_amount_map->end())) {
          txin_amount_map->emplace(
              token, txin.GetInflationKeys().GetAmount().GetSatoshiValue());
        }
      } else if (txin_amount_map->find(asset) == txin_amount_map->end()) {
        // At the time of reissuance, add to map if it is not registered asset.
        txin_amount_map->emplace(
            asset, txin.GetIssuanceAmount().GetAmount().GetSatoshiValue());
      } else {
        // At the time of reissuance,
        // add to map if it is not registered asset of utxo.
        OutPoint outpoint(txin.GetTxid(), txin.GetVout());
        std::vector<OutPoint>& outpoint_list = asset_utxo_map[asset];
        if (std::find(outpoint_list.begin(), outpoint_list.end(), outpoint) ==
            outpoint_list.end()) {
          (*txin_amount_map)[asset] +=
              txin.GetIssuanceAmount().GetAmount().GetSatoshiValue();
        }
      }
    }
  }
}